

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::NetParameter::SharedCtor(NetParameter *this)

{
  this->_cached_size_ = 0;
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->state_ = (NetState *)0x0;
  this->force_backward_ = false;
  this->debug_info_ = false;
  return;
}

Assistant:

void NetParameter::SharedCtor() {
  _cached_size_ = 0;
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&state_, 0, reinterpret_cast<char*>(&debug_info_) -
    reinterpret_cast<char*>(&state_) + sizeof(debug_info_));
}